

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

int __thiscall
sjtu::DynamicFileManager<sjtu::trainType>::init
          (DynamicFileManager<sjtu::trainType> *this,EVP_PKEY_CTX *ctx)

{
  LRUCache<sjtu::trainType> *pLVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  trainType *this_00;
  byte in_CL;
  locType loc;
  trainType tmp;
  ofstream outfile;
  ifstream infile;
  size_t in_stack_ffffffffffff53e8;
  string *psVar5;
  LRUCache<sjtu::trainType> *in_stack_ffffffffffff53f0;
  undefined8 local_abe0;
  undefined1 local_abd8 [40];
  LRUCache<sjtu::trainType> *in_stack_ffffffffffff5450;
  char local_430 [512];
  undefined1 local_230 [539];
  byte local_15;
  EVP_PKEY_CTX *local_10;
  DynamicFileManager<sjtu::trainType> *local_8;
  
  local_15 = in_CL & 1;
  local_10 = ctx;
  local_8 = this;
  if (((this->super_FileManager_Base<sjtu::trainType>).cache != (LRUCache<sjtu::trainType> *)0x0) &&
     (pLVar1 = (this->super_FileManager_Base<sjtu::trainType>).cache,
     pLVar1 != (LRUCache<sjtu::trainType> *)0x0)) {
    LRUCache<sjtu::trainType>::~LRUCache(in_stack_ffffffffffff5450);
    operator_delete(pLVar1,0x48);
  }
  this_00 = (trainType *)operator_new(0x48);
  LRUCache<sjtu::trainType>::LRUCache
            (in_stack_ffffffffffff53f0,in_stack_ffffffffffff53e8,(fstream *)0x1258a3);
  (this->super_FileManager_Base<sjtu::trainType>).cache = (LRUCache<sjtu::trainType> *)this_00;
  std::ifstream::ifstream(local_230,(string *)ctx,_S_in);
  bVar2 = std::ifstream::is_open();
  if (((bVar2 & 1) == 0) || ((local_15 & 1) != 0)) {
    (this->super_FileManager_Base<sjtu::trainType>).is_newfile = true;
    _Var3 = std::operator|(_S_out,_S_bin);
    std::ofstream::ofstream(local_430,(string *)ctx,_Var3);
    trainType::trainType(this_00);
    std::ostream::write(local_430,(long)local_abd8);
    local_abe0 = 0xa7a8;
    std::ostream::seekp((long)local_430,0xffff5858);
    std::ostream::write(local_430,(long)&local_abe0);
    std::ofstream::close();
    std::ofstream::~ofstream(local_430);
  }
  else {
    (this->super_FileManager_Base<sjtu::trainType>).is_newfile = false;
  }
  std::ifstream::close();
  psVar5 = (string *)&(this->super_FileManager_Base<sjtu::trainType>).file;
  _Var3 = std::operator|(_S_in,_S_out);
  std::operator|(_Var3,_S_bin);
  std::fstream::open(psVar5,(_Ios_Openmode)ctx);
  iVar4 = std::ifstream::~ifstream(local_230);
  return iVar4;
}

Assistant:

virtual void init(std::string filepath , unsigned int cache_size , bool is_reset = false) override
		{
			if (cache) delete cache;
			cache = new LRUCache<T>(cache_size , file);
			std::ifstream infile(filepath , std::ios_base::in);
			if (!infile.is_open() || is_reset)
			{
				is_newfile = true;
				std::ofstream outfile(filepath , std::ios_base::out | std::ios_base::binary);
				T tmp;
				outfile.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				locType loc = sizeof (T);
				outfile.seekp(- sizeof (T) , std::ios_base::cur) , outfile.write(reinterpret_cast<char *> (&loc) , sizeof (locType));
				outfile.close();
			}else is_newfile = false;
			infile.close();
			file.open(filepath , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
		}